

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_set(__mpz_struct *r,__mpz_struct *x)

{
  uint uVar1;
  uint uVar2;
  mp_limb_t *d;
  
  if (r != x) {
    uVar1 = x->_mp_size;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (r->_mp_alloc < (int)uVar2) {
      d = mpz_realloc(r,(ulong)uVar2);
    }
    else {
      d = r->_mp_d;
    }
    mpn_copyi(d,x->_mp_d,(ulong)uVar2);
    r->_mp_size = x->_mp_size;
  }
  return;
}

Assistant:

void
mpz_set (mpz_t r, const mpz_t x)
{
  /* Allow the NOP r == x */
  if (r != x)
    {
      mp_size_t n;
      mp_ptr rp;

      n = GMP_ABS (x->_mp_size);
      rp = MPZ_REALLOC (r, n);

      mpn_copyi (rp, x->_mp_d, n);
      r->_mp_size = x->_mp_size;
    }
}